

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

void __thiscall soul::heart::AdvanceClock::AdvanceClock(AdvanceClock *this,CodeLocation *l)

{
  CodeLocation local_18;
  
  local_18.sourceCode.object = (l->sourceCode).object;
  local_18.location.data = (l->location).data;
  (l->sourceCode).object = (SourceCodeText *)0x0;
  Statement::Statement(&this->super_Statement,&local_18);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_18.sourceCode.object);
  (this->super_Statement).super_Object._vptr_Object = (_func_int **)&PTR__Object_002d0630;
  return;
}

Assistant:

AdvanceClock (CodeLocation l) : Statement (std::move (l)) {}